

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cc
# Opt level: O3

int __thiscall iqnet::Socket::get_last_error(Socket *this)

{
  socklen_t int_sz;
  int err;
  socklen_t local_10;
  int local_c;
  
  local_c = 0;
  local_10 = 4;
  getsockopt(this->sock,1,4,&local_c,&local_10);
  return local_c;
}

Assistant:

int Socket::get_last_error()
{
  int err = 0;
#ifndef WIN32
  socklen_t int_sz = sizeof(err);
  ::getsockopt( sock, SOL_SOCKET, SO_ERROR, &err, &int_sz );
#else
  err=WSAGetLastError();
#endif
  return err;
}